

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssvectorbase.h
# Opt level: O3

void __thiscall
soplex::
SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::SSVectorBase(SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *this,int p_dim,shared_ptr<soplex::Tolerances> *tol)

{
  pointer pnVar1;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *v;
  pointer pnVar2;
  int n;
  
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::VectorBase(&this->
                super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ,p_dim);
  (this->super_IdxSet).num = 0;
  (this->super_IdxSet).len = 0;
  (this->super_IdxSet).idx = (int *)0x0;
  (this->super_IdxSet).freeArray = false;
  (this->super_IdxSet)._vptr_IdxSet = (_func_int **)&PTR__SSVectorBase_006a3ce0;
  this->setupStatus = true;
  (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  n = 1;
  if (1 < p_dim) {
    n = p_dim;
  }
  (this->super_IdxSet).len = n;
  spx_alloc<int*>(&(this->super_IdxSet).idx,n);
  pnVar1 = (this->
           super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pnVar2 = (this->
                super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pnVar2 != pnVar1; pnVar2 = pnVar2 + 1) {
    (pnVar2->m_backend).fpclass = cpp_dec_float_finite;
    (pnVar2->m_backend).prec_elem = 0x10;
    (pnVar2->m_backend).data._M_elems[0] = 0;
    (pnVar2->m_backend).data._M_elems[1] = 0;
    (pnVar2->m_backend).data._M_elems[2] = 0;
    (pnVar2->m_backend).data._M_elems[3] = 0;
    (pnVar2->m_backend).data._M_elems[4] = 0;
    (pnVar2->m_backend).data._M_elems[5] = 0;
    (pnVar2->m_backend).data._M_elems[6] = 0;
    (pnVar2->m_backend).data._M_elems[7] = 0;
    (pnVar2->m_backend).data._M_elems[8] = 0;
    (pnVar2->m_backend).data._M_elems[9] = 0;
    (pnVar2->m_backend).data._M_elems[10] = 0;
    (pnVar2->m_backend).data._M_elems[0xb] = 0;
    (pnVar2->m_backend).data._M_elems[0xc] = 0;
    (pnVar2->m_backend).data._M_elems[0xd] = 0;
    (pnVar2->m_backend).data._M_elems[0xe] = 0;
    (pnVar2->m_backend).data._M_elems[0xf] = 0;
    *(undefined8 *)((long)(pnVar2->m_backend).data._M_elems + 0x3d) = 0;
  }
  (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (tol->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,
             &(tol->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>)._M_refcount)
  ;
  return;
}

Assistant:

explicit SSVectorBase(int p_dim, std::shared_ptr<Tolerances> tol = nullptr)
      : VectorBase<R>(p_dim)
      , IdxSet()
      , setupStatus(true)
   {
      len = (p_dim < 1) ? 1 : p_dim;
      spx_alloc(idx, len);
      VectorBase<R>::clear();
      _tolerances = tol;

      assert(isConsistent());
   }